

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http_thread.c
# Opt level: O1

mk_http_thread *
mk_http_thread_create
          (int type,mk_vhost_handler *handler,mk_http_session *session,mk_http_request *request,
          int n_params,mk_list *params)

{
  void *pvVar1;
  undefined4 *puVar2;
  cothread_t pvVar3;
  long lVar4;
  int *__pointer;
  unsigned_long _zzq_result;
  size_t stack_size;
  unsigned_long _zzq_args [6];
  size_t local_70 [3];
  long local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  pvVar1 = pthread_getspecific(mk_tls_sched_worker_node);
  if (pvVar1 != (void *)0x0) {
    puVar2 = (undefined4 *)malloc(0x58);
    if (puVar2 == (undefined4 *)0x0) {
      perror("malloc");
    }
    if (puVar2 == (undefined4 *)0x0) {
      puVar2 = (undefined4 *)0x0;
    }
    else {
      *(undefined8 *)(puVar2 + 8) = 0;
    }
    if (puVar2 != (undefined4 *)0x0) {
      *(mk_http_session **)(puVar2 + 0xc) = session;
      *(mk_http_request **)(puVar2 + 0xe) = request;
      *(undefined4 **)(puVar2 + 0x10) = puVar2;
      puVar2[10] = 0;
      request->thread = (mk_http_thread *)(puVar2 + 10);
      lVar4 = *(long *)((long)pvVar1 + 0x80);
      *(undefined4 **)((long)pvVar1 + 0x80) = puVar2 + 0x12;
      *(long *)(puVar2 + 0x14) = (long)pvVar1 + 0x80;
      *(long *)(puVar2 + 0x12) = lVar4;
      *(undefined4 **)(lVar4 + 8) = puVar2 + 0x12;
      pvVar3 = co_active();
      *(cothread_t *)(puVar2 + 2) = pvVar3;
      lVar4 = __sysconf(0x4b);
      pvVar3 = co_create((uint)((ulong)(lVar4 * 3 - (lVar4 * 3 >> 0x3f)) >> 1),thread_cb_init_vars,
                         local_70);
      *(cothread_t *)(puVar2 + 4) = pvVar3;
      local_70[1] = 0x1501;
      local_70[2] = *(size_t *)(puVar2 + 4);
      local_58 = local_70[2] + local_70[0];
      local_50 = 0;
      local_48 = 0;
      local_40 = 0;
      *puVar2 = 0;
      __pointer = (int *)pthread_getspecific(mk_http_thread_libco_params);
      if (__pointer == (int *)0x0) {
        __pointer = (int *)calloc(1,0x38);
        if (__pointer == (int *)0x0) {
          mk_print(0x1001,"libco thread params could not be allocated.");
        }
        pthread_setspecific(mk_http_thread_libco_params,__pointer);
      }
      *__pointer = type;
      *(mk_vhost_handler **)(__pointer + 2) = handler;
      *(mk_http_session **)(__pointer + 4) = session;
      *(mk_http_request **)(__pointer + 6) = request;
      __pointer[8] = n_params;
      *(mk_list **)(__pointer + 10) = params;
      *(undefined4 **)(__pointer + 0xc) = puVar2;
      co_switch(*(cothread_t *)(puVar2 + 4));
      return (mk_http_thread *)(puVar2 + 10);
    }
  }
  return (mk_http_thread *)0x0;
}

Assistant:

struct mk_http_thread *mk_http_thread_create(int type,
                                             struct mk_vhost_handler *handler,
                                             struct mk_http_session *session,
                                             struct mk_http_request *request,
                                             int n_params,
                                             struct mk_list *params)
{
    size_t stack_size;
    struct mk_thread *th = NULL;
    struct mk_http_thread *mth;
    struct mk_sched_worker *sched;

    sched = mk_sched_get_thread_conf();
    if (!sched) {
        return NULL;
    }

    th = mk_thread_new(sizeof(struct mk_http_thread), NULL);
    if (!th) {
        return NULL;
    }

    mth = (struct mk_http_thread *) MK_THREAD_DATA(th);
    if (!mth) {
        return NULL;
    }

    mth->session = session;
    mth->request = request;
    mth->parent  = th;
    mth->close   = MK_FALSE;
    request->thread = mth;
    mk_list_add(&mth->_head, &sched->threads);

    th->caller = co_active();
    th->callee = co_create(MK_THREAD_STACK_SIZE,
                           thread_cb_init_vars, &stack_size);

#ifdef MK_HAVE_VALGRIND
    th->valgrind_stack_id = VALGRIND_STACK_REGISTER(th->callee,
                                                    ((char *)th->callee) + stack_size);
#endif

    /* Workaround for makecontext() */
    thread_params_set(th, type, handler, session, request, n_params, params);

    return mth;
}